

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGDumpValidError(xmlRelaxNGValidCtxtPtr ctxt)

{
  int iVar1;
  xmlRelaxNGValidErrorPtr pxVar2;
  xmlRelaxNGValidErrorPtr pxVar3;
  xmlRelaxNGValidErrorPtr dup;
  xmlRelaxNGValidErrorPtr err;
  int local_18;
  int k;
  int j;
  int i;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  k = 0;
  err._4_4_ = 0;
  do {
    if (ctxt->errNr <= k) {
      ctxt->errNr = 0;
      return;
    }
    pxVar2 = ctxt->errTab + k;
    if (err._4_4_ < 5) {
      for (local_18 = 0; local_18 < k; local_18 = local_18 + 1) {
        pxVar3 = ctxt->errTab + local_18;
        if ((((pxVar2->err == pxVar3->err) && (pxVar2->node == pxVar3->node)) &&
            (iVar1 = xmlStrEqual(pxVar2->arg1,pxVar3->arg1), iVar1 != 0)) &&
           (iVar1 = xmlStrEqual(pxVar2->arg2,pxVar3->arg2), iVar1 != 0)) goto LAB_001ca661;
      }
      xmlRelaxNGShowValidError(ctxt,pxVar2->err,pxVar2->node,pxVar2->seq,pxVar2->arg1,pxVar2->arg2);
      err._4_4_ = err._4_4_ + 1;
    }
LAB_001ca661:
    if ((pxVar2->flags & 1U) != 0) {
      if (pxVar2->arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2->arg1);
      }
      pxVar2->arg1 = (xmlChar *)0x0;
      if (pxVar2->arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2->arg2);
      }
      pxVar2->arg2 = (xmlChar *)0x0;
      pxVar2->flags = 0;
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void
xmlRelaxNGDumpValidError(xmlRelaxNGValidCtxtPtr ctxt)
{
    int i, j, k;
    xmlRelaxNGValidErrorPtr err, dup;

    for (i = 0, k = 0; i < ctxt->errNr; i++) {
        err = &ctxt->errTab[i];
        if (k < MAX_ERROR) {
            for (j = 0; j < i; j++) {
                dup = &ctxt->errTab[j];
                if ((err->err == dup->err) && (err->node == dup->node) &&
                    (xmlStrEqual(err->arg1, dup->arg1)) &&
                    (xmlStrEqual(err->arg2, dup->arg2))) {
                    goto skip;
                }
            }
            xmlRelaxNGShowValidError(ctxt, err->err, err->node, err->seq,
                                     err->arg1, err->arg2);
            k++;
        }
      skip:
        if (err->flags & ERROR_IS_DUP) {
            if (err->arg1 != NULL)
                xmlFree((xmlChar *) err->arg1);
            err->arg1 = NULL;
            if (err->arg2 != NULL)
                xmlFree((xmlChar *) err->arg2);
            err->arg2 = NULL;
            err->flags = 0;
        }
    }
    ctxt->errNr = 0;
}